

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O0

MPP_RET avs2d_parse_prepare_fast(Avs2dCtx_t *p_dec,MppPacket *pkt,HalDecTask *task)

{
  size_t sVar1;
  RK_U32 local_48;
  uint local_44;
  RK_U32 remain;
  RK_U32 pkt_length;
  RK_U8 *p_end;
  RK_U8 *p_start;
  RK_U8 *p_curdata;
  HalDecTask *pHStack_20;
  MPP_RET ret;
  HalDecTask *task_local;
  MppPacket *pkt_local;
  Avs2dCtx_t *p_dec_local;
  
  p_curdata._4_4_ = MPP_OK;
  p_start = (RK_U8 *)0x0;
  p_end = (RK_U8 *)0x0;
  _remain = (RK_U8 *)0x0;
  local_44 = 0;
  local_48 = 0;
  pHStack_20 = task;
  task_local = (HalDecTask *)pkt;
  pkt_local = &p_dec->frame_slots;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","In.","avs2d_parse_prepare_fast");
  }
  sVar1 = mpp_packet_get_length(task_local);
  local_44 = (uint)sVar1;
  p_end = (RK_U8 *)mpp_packet_get_pos(task_local);
  _remain = p_end + ((ulong)local_44 - 1);
  p_start = p_end;
  do {
    if ((_remain <= p_start) ||
       (p_curdata._4_4_ =
             avs2_split_nalu((Avs2dCtx_t *)pkt_local,p_start,((int)_remain - (int)p_start) + 1,0,
                             &local_48), p_curdata._4_4_ != MPP_OK)) goto LAB_001ac0c6;
    p_start = _remain + (1 - (ulong)local_48);
  } while ((*(int *)((long)pkt_local + 0x138c) == 0) &&
          ((*(char *)((long)pkt_local[0xe] + (ulong)(*(int *)(pkt_local + 0xf) - 1) * 0x10 + 0xc) !=
            '\x01' && (p_start < _remain))));
  pHStack_20->valid = 1;
LAB_001ac0c6:
  mpp_packet_set_pos(task_local,_remain + 1);
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","after split, remain %d, task->valid %d\n","avs2d_parse_prepare_fast"
               ,(ulong)local_48,(ulong)pHStack_20->valid);
  }
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","Out.","avs2d_parse_prepare_fast");
  }
  return p_curdata._4_4_;
}

Assistant:

MPP_RET avs2d_parse_prepare_fast(Avs2dCtx_t *p_dec, MppPacket *pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *p_curdata = NULL;
    RK_U8 *p_start = NULL;
    RK_U8 *p_end = NULL;
    RK_U32 pkt_length = 0;
    RK_U32 remain = 0;

    AVS2D_PARSE_TRACE("In.");

    pkt_length = (RK_U32) mpp_packet_get_length(pkt);

    p_curdata = p_start = (RK_U8 *) mpp_packet_get_pos(pkt);
    p_end = p_start + pkt_length - 1;

    while (p_curdata < p_end) {
        ret = avs2_split_nalu(p_dec, p_curdata, p_end - p_curdata + 1, 0, &remain);

        if (ret) {
            break;
        } else {
            p_curdata = p_end - remain + 1;
        }

        if (p_dec->new_frame_flag || (p_dec->p_nals[p_dec->nal_cnt - 1].eof == 1)
            || p_curdata >= p_end) {
            task->valid = 1;
            break;
        }
    }

    // sequence_end_code and video_edit_code at the end of a packet will be ignored.
    mpp_packet_set_pos(pkt, p_end + 1);
    AVS2D_PARSE_TRACE("after split, remain %d, task->valid %d\n", remain, task->valid);

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}